

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O1

void cf_hmac_drbg_gen_additional(cf_hmac_drbg *ctx,void *addnl,size_t naddnl,void *out,size_t nout)

{
  ulong uVar1;
  ulong uVar2;
  ulong __n;
  void *__dest;
  cf_hmac_ctx local_308;
  
  if (nout != 0) {
    do {
      uVar1 = 0x10000;
      if (nout < 0x10000) {
        uVar1 = nout;
      }
      if (ctx->reseed_counter == 0) {
        abort();
      }
      uVar2 = uVar1;
      __dest = out;
      if (naddnl != 0) {
        hmac_drbg_update(ctx,addnl,naddnl,(void *)0x0,0,(void *)0x0,0);
      }
      do {
        memcpy(&local_308,&ctx->hmac,0x2d8);
        cf_hmac_update(&local_308,ctx,((ctx->hmac).hash)->hashsz);
        cf_hmac_finish(&local_308,ctx->V);
        __n = ((ctx->hmac).hash)->hashsz;
        if (uVar2 <= __n) {
          __n = uVar2;
        }
        memcpy(__dest,ctx,__n);
        uVar2 = uVar2 - __n;
        __dest = (void *)((long)__dest + __n);
      } while (uVar2 != 0);
      hmac_drbg_update(ctx,addnl,naddnl,(void *)0x0,0,(void *)0x0,0);
      ctx->reseed_counter = ctx->reseed_counter + 1;
      out = (void *)((long)out + uVar1);
      addnl = (void *)0x0;
      naddnl = 0;
      nout = nout - uVar1;
    } while (nout != 0);
  }
  return;
}

Assistant:

void cf_hmac_drbg_gen_additional(cf_hmac_drbg *ctx,
                                 const void *addnl, size_t naddnl,
                                 void *out, size_t nout)
{
  uint8_t *bout = out;

  while (nout != 0)
  {
    size_t take = MIN(MAX_DRBG_GENERATE, nout);
    hmac_drbg_generate(ctx, addnl, naddnl, bout, take);
    bout += take;
    nout -= take;

    /* Add additional data only once. */
    addnl = NULL;
    naddnl = 0;
  }
}